

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layernorm_x86_avx.cpp
# Opt level: O2

void ncnn::layernorm(float *ptr,float *gamma_ptr,float *beta_ptr,float eps,int elemcount,
                    int elempack)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  bool bVar25;
  bool bVar26;
  bool bVar27;
  int iVar28;
  int i_1;
  undefined1 (*pauVar29) [64];
  int i;
  int iVar30;
  float *ptr0;
  long lVar31;
  float *ptr0_1;
  undefined1 auVar36 [32];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar37 [64];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 in_register_00001204 [60];
  undefined1 auVar40 [16];
  undefined1 auVar41 [64];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  float fVar47;
  float fVar48;
  float fVar54;
  __m128 _mean0;
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  float fVar55;
  undefined1 auVar52 [16];
  float fVar56;
  float fVar57;
  float fVar58;
  float fVar59;
  undefined1 auVar53 [64];
  float fVar60;
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar64 [16];
  float fVar63;
  float fVar66;
  float fVar67;
  float fVar68;
  float fVar69;
  float fVar70;
  float fVar71;
  undefined1 auVar65 [64];
  undefined1 auVar72 [16];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [16];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  
  auVar38._4_60_ = in_register_00001204;
  auVar38._0_4_ = eps;
  iVar28 = elempack * elemcount;
  auVar65 = ZEXT1664(ZEXT816(0) << 0x40);
  pauVar29 = (undefined1 (*) [64])ptr;
  for (iVar30 = 0; iVar30 + 0xf < iVar28; iVar30 = iVar30 + 0x10) {
    auVar65 = vaddps_avx512f(auVar65,*pauVar29);
    pauVar29 = pauVar29 + 1;
  }
  auVar53 = ZEXT1664(ZEXT816(0) << 0x40);
  while( true ) {
    fVar47 = auVar53._0_4_;
    fVar48 = auVar53._4_4_;
    fVar54 = auVar53._8_4_;
    fVar5 = auVar53._12_4_;
    fVar56 = auVar53._16_4_;
    fVar57 = auVar53._20_4_;
    fVar58 = auVar53._24_4_;
    fVar59 = auVar53._28_4_;
    if (iVar28 <= iVar30 + 7) break;
    auVar53 = ZEXT3264(CONCAT428(fVar59 + *(float *)(*pauVar29 + 0x1c),
                                 CONCAT424(fVar58 + *(float *)(*pauVar29 + 0x18),
                                           CONCAT420(fVar57 + *(float *)(*pauVar29 + 0x14),
                                                     CONCAT416(fVar56 + *(float *)(*pauVar29 + 0x10)
                                                               ,CONCAT412(fVar5 + *(float *)(*
                                                  pauVar29 + 0xc),
                                                  CONCAT48(fVar54 + *(float *)(*pauVar29 + 8),
                                                           CONCAT44(fVar48 + *(float *)(*pauVar29 +
                                                                                       4),
                                                                    fVar47 + *(float *)*pauVar29))))
                                                  ))));
    pauVar29 = (undefined1 (*) [64])(*pauVar29 + 0x20);
    iVar30 = iVar30 + 8;
  }
  auVar32 = ZEXT816(0) << 0x40;
  while( true ) {
    fVar60 = auVar32._4_4_;
    fVar4 = auVar32._8_4_;
    fVar6 = auVar32._12_4_;
    if (iVar28 <= iVar30 + 3) break;
    auVar32._0_4_ = auVar32._0_4_ + *(float *)*pauVar29;
    auVar32._4_4_ = fVar60 + *(float *)(*pauVar29 + 4);
    auVar32._8_4_ = fVar4 + *(float *)(*pauVar29 + 8);
    auVar32._12_4_ = fVar6 + *(float *)(*pauVar29 + 0xc);
    pauVar29 = (undefined1 (*) [64])(*pauVar29 + 0x10);
    iVar30 = iVar30 + 4;
  }
  auVar41 = ZEXT1664(ZEXT816(0) << 0x40);
  while( true ) {
    auVar40 = auVar41._0_16_;
    if (iVar28 <= iVar30) break;
    auVar41 = ZEXT464((uint)(auVar41._0_4_ + *(float *)*pauVar29));
    pauVar29 = (undefined1 (*) [64])(*pauVar29 + 4);
    iVar30 = iVar30 + 1;
  }
  if (elempack == 0x10) {
    auVar41 = vbroadcastss_avx512f(ZEXT416((uint)(1.0 / (float)elemcount)));
    auVar65 = vmulps_avx512f(auVar65,auVar41);
LAB_004a22de:
    bVar25 = false;
  }
  else {
    auVar35 = vextractf64x4_avx512f(auVar65,1);
    fVar63 = auVar65._0_4_;
    fVar66 = auVar65._4_4_;
    fVar67 = auVar65._8_4_;
    fVar68 = auVar65._12_4_;
    fVar69 = auVar65._16_4_;
    fVar70 = auVar65._24_4_;
    fVar71 = auVar65._28_4_;
    fVar7 = auVar35._0_4_;
    fVar55 = auVar35._4_4_;
    fVar8 = auVar35._8_4_;
    fVar9 = auVar35._12_4_;
    fVar10 = auVar35._16_4_;
    fVar11 = auVar35._24_4_;
    fVar12 = auVar35._28_4_;
    if (elempack == 1) {
      auVar61._0_4_ = fVar63 + fVar7 + fVar69 + fVar10;
      auVar61._4_4_ = fVar66 + fVar55 + fVar66 + fVar55;
      auVar61._8_4_ = fVar67 + fVar8 + fVar70 + fVar11;
      auVar61._12_4_ = fVar68 + fVar9 + fVar71 + fVar12;
      auVar40 = vshufpd_avx(auVar61,auVar61,1);
      auVar62._0_4_ = auVar40._0_4_ + auVar61._0_4_;
      auVar62._4_4_ = auVar40._4_4_ + auVar61._4_4_;
      auVar62._8_4_ = auVar40._8_4_ + auVar61._8_4_;
      auVar62._12_4_ = auVar40._12_4_ + auVar61._12_4_;
      auVar40 = vmovshdup_avx(auVar62);
      auVar52._0_4_ = fVar56 + fVar47;
      auVar52._4_4_ = fVar57 + fVar48;
      auVar52._8_4_ = fVar58 + fVar54;
      auVar52._12_4_ = fVar59 + fVar5;
      auVar33 = vshufps_avx(auVar32,auVar52,0x11);
      auVar32 = vshufps_avx(auVar32,auVar52,0xbb);
      auVar46._0_4_ = auVar32._0_4_ + auVar33._0_4_;
      auVar46._4_4_ = auVar32._4_4_ + auVar33._4_4_;
      auVar46._8_4_ = auVar32._8_4_ + auVar33._8_4_;
      auVar46._12_4_ = auVar32._12_4_ + auVar33._12_4_;
      auVar32 = vshufpd_avx(auVar46,auVar46,1);
      auVar33._0_4_ = auVar46._0_4_ + auVar32._0_4_;
      auVar33._4_4_ = auVar46._4_4_ + auVar32._4_4_;
      auVar33._8_4_ = auVar46._8_4_ + auVar32._8_4_;
      auVar33._12_4_ = auVar46._12_4_ + auVar32._12_4_;
      auVar32 = vhaddps_avx(auVar33,auVar33);
      auVar40._0_4_ =
           (auVar62._0_4_ + auVar40._0_4_ + auVar41._0_4_ + auVar32._0_4_) / (float)elemcount;
      auVar40._4_12_ = SUB6012((undefined1  [60])0x0,0);
      auVar65 = vbroadcastss_avx512f(auVar40);
      auVar32 = auVar65._0_16_;
      bVar27 = true;
      bVar25 = false;
      bVar26 = false;
      auVar53 = ZEXT3264(auVar65._0_32_);
      goto LAB_004a22e7;
    }
    if (elempack == 4) {
      fVar55 = fVar66 + fVar48 + fVar55;
      fVar48 = 1.0 / (float)elemcount;
      auVar32._0_4_ = (fVar69 + fVar56 + fVar10 + fVar63 + fVar47 + fVar7 + auVar32._0_4_) * fVar48;
      auVar32._4_4_ = (fVar55 + fVar55 + fVar60) * fVar48;
      auVar32._8_4_ = (fVar70 + fVar58 + fVar11 + fVar67 + fVar54 + fVar8 + fVar4) * fVar48;
      auVar32._12_4_ = (fVar71 + fVar59 + fVar12 + fVar68 + fVar5 + fVar9 + fVar6) * fVar48;
      auVar53 = ZEXT3264(CONCAT1616(auVar32,auVar32));
      auVar65 = vshuff64x2_avx512f(ZEXT1664(auVar32),ZEXT1664(auVar32),0);
      bVar26 = true;
      bVar27 = false;
      bVar25 = false;
      goto LAB_004a22e7;
    }
    if (elempack != 8) goto LAB_004a22de;
    fVar60 = 1.0 / (float)elemcount;
    auVar36._4_4_ = (fVar66 + fVar48 + fVar55) * fVar60;
    auVar36._0_4_ = (fVar63 + fVar47 + fVar7) * fVar60;
    auVar36._8_4_ = (fVar67 + fVar54 + fVar8) * fVar60;
    auVar36._12_4_ = (fVar68 + fVar5 + fVar9) * fVar60;
    auVar36._16_4_ = (fVar69 + fVar56 + fVar10) * fVar60;
    auVar36._20_4_ = (auVar65._20_4_ + fVar57 + auVar35._20_4_) * fVar60;
    auVar36._24_4_ = (fVar70 + fVar58 + fVar11) * fVar60;
    auVar36._28_4_ = fVar71 + fVar59 + fVar12;
    auVar53 = ZEXT3264(auVar36);
    auVar65 = vinsertf64x4_avx512f(auVar53,auVar36,1);
    bVar25 = true;
  }
  bVar27 = false;
  bVar26 = false;
LAB_004a22e7:
  auVar35 = auVar53._0_32_;
  auVar41 = ZEXT1664(ZEXT816(0) << 0x40);
  pauVar29 = (undefined1 (*) [64])ptr;
  for (iVar30 = 0; iVar30 + 0xf < iVar28; iVar30 = iVar30 + 0x10) {
    auVar37 = vsubps_avx512f(*pauVar29,auVar65);
    auVar41 = vfmadd231ps_avx512f(auVar41,auVar37,auVar37);
    pauVar29 = pauVar29 + 1;
  }
  auVar33 = ZEXT816(0) << 0x40;
  while( true ) {
    auVar73 = ZEXT1632(auVar33);
    if (iVar28 <= iVar30 + 7) break;
    auVar36 = vsubps_avx(*(undefined1 (*) [32])*pauVar29,auVar35);
    auVar33 = vfmadd231ps_fma(ZEXT1632(auVar33),auVar36,auVar36);
    pauVar29 = (undefined1 (*) [64])(*pauVar29 + 0x20);
    iVar30 = iVar30 + 8;
  }
  auVar46 = ZEXT816(0) << 0x40;
  for (; iVar30 + 3 < iVar28; iVar30 = iVar30 + 4) {
    auVar52 = vsubps_avx(*(undefined1 (*) [16])*pauVar29,auVar32);
    auVar46 = vfmadd231ps_fma(auVar46,auVar52,auVar52);
    pauVar29 = (undefined1 (*) [64])(*pauVar29 + 0x10);
  }
  auVar52 = ZEXT816(0) << 0x40;
  for (; iVar30 < iVar28; iVar30 = iVar30 + 1) {
    auVar61 = ZEXT416((uint)(*(float *)*pauVar29 - auVar40._0_4_));
    auVar52 = vfmadd231ss_fma(auVar52,auVar61,auVar61);
    pauVar29 = (undefined1 (*) [64])(*pauVar29 + 4);
  }
  if (elempack == 0x10) {
    auVar38 = vbroadcastss_avx512f(auVar38._0_16_);
    auVar37 = vbroadcastss_avx512f(ZEXT416((uint)(1.0 / (float)elemcount)));
    auVar38 = vfmadd213ps_avx512f(auVar37,auVar41,auVar38);
    auVar36 = vrsqrtps_avx(auVar38._0_32_);
    auVar34 = vextractf64x4_avx512f(auVar38,1);
    auVar34 = vrsqrtps_avx(auVar34);
    auVar41 = vinsertf64x4_avx512f(ZEXT3264(auVar36),auVar34,1);
    auVar65 = vmulps_avx512f(auVar41,auVar65);
  }
  if (bVar25) {
    auVar35 = vextractf64x4_avx512f(auVar41,1);
    auVar34._0_4_ = auVar41._0_4_ + auVar33._0_4_ + auVar35._0_4_;
    auVar34._4_4_ = auVar41._4_4_ + auVar33._4_4_ + auVar35._4_4_;
    auVar34._8_4_ = auVar41._8_4_ + auVar33._8_4_ + auVar35._8_4_;
    auVar34._12_4_ = auVar41._12_4_ + auVar33._12_4_ + auVar35._12_4_;
    auVar34._16_4_ = auVar41._16_4_ + 0.0 + auVar35._16_4_;
    auVar34._20_4_ = auVar41._20_4_ + 0.0 + auVar35._20_4_;
    auVar34._24_4_ = auVar41._24_4_ + 0.0 + auVar35._24_4_;
    auVar34._28_4_ = auVar41._28_4_ + 0.0 + auVar35._28_4_;
    auVar75._4_4_ = eps;
    auVar75._0_4_ = eps;
    auVar75._8_4_ = eps;
    auVar75._12_4_ = eps;
    auVar75._16_4_ = eps;
    auVar75._20_4_ = eps;
    auVar75._24_4_ = eps;
    auVar75._28_4_ = eps;
    auVar74._0_4_ = 1.0 / (float)elemcount;
    auVar74._4_4_ = auVar74._0_4_;
    auVar74._8_4_ = auVar74._0_4_;
    auVar74._12_4_ = auVar74._0_4_;
    auVar74._16_4_ = auVar74._0_4_;
    auVar74._20_4_ = auVar74._0_4_;
    auVar74._24_4_ = auVar74._0_4_;
    auVar74._28_4_ = auVar74._0_4_;
    auVar33 = vfmadd213ps_fma(auVar74,auVar34,auVar75);
    auVar73 = vrsqrtps_avx(ZEXT1632(auVar33));
    auVar65._0_4_ = auVar73._0_4_ * auVar53._0_4_;
    auVar65._4_4_ = auVar73._4_4_ * auVar53._4_4_;
    auVar65._8_4_ = auVar73._8_4_ * auVar53._8_4_;
    auVar65._12_4_ = auVar73._12_4_ * auVar53._12_4_;
    auVar65._16_4_ = auVar73._16_4_ * auVar53._16_4_;
    auVar65._20_4_ = auVar73._20_4_ * auVar53._20_4_;
    auVar65._28_36_ = auVar53._28_36_;
    auVar65._24_4_ = auVar73._24_4_ * auVar53._24_4_;
    auVar35 = auVar65._0_32_;
    auVar41 = vinsertf64x4_avx512f(ZEXT3264(auVar73),auVar73,1);
    auVar65 = vinsertf64x4_avx512f(ZEXT3264(auVar35),auVar35,1);
  }
  auVar42 = auVar32;
  if (bVar26) {
    auVar35 = vextractf64x4_avx512f(auVar41,1);
    fVar54 = auVar41._4_4_ + auVar73._4_4_ + auVar35._4_4_;
    auVar49._0_4_ =
         auVar41._0_4_ + auVar73._0_4_ + auVar35._0_4_ + auVar46._0_4_ +
         auVar41._16_4_ + auVar73._16_4_ + auVar35._16_4_;
    auVar49._4_4_ = fVar54 + auVar46._4_4_ + fVar54;
    auVar49._8_4_ =
         auVar41._8_4_ + auVar73._8_4_ + auVar35._8_4_ + auVar46._8_4_ +
         auVar41._24_4_ + auVar73._24_4_ + auVar35._24_4_;
    auVar49._12_4_ =
         auVar41._12_4_ + auVar73._12_4_ + auVar35._12_4_ + auVar46._12_4_ +
         auVar41._28_4_ + auVar73._28_4_ + auVar35._28_4_;
    auVar64._4_4_ = eps;
    auVar64._0_4_ = eps;
    auVar64._8_4_ = eps;
    auVar64._12_4_ = eps;
    auVar72._0_4_ = 1.0 / (float)elemcount;
    auVar72._4_4_ = auVar72._0_4_;
    auVar72._8_4_ = auVar72._0_4_;
    auVar72._12_4_ = auVar72._0_4_;
    auVar33 = vfmadd213ps_fma(auVar72,auVar49,auVar64);
    auVar46 = vrsqrtps_avx(auVar33);
    auVar42._0_4_ = auVar46._0_4_ * auVar32._0_4_;
    auVar42._4_4_ = auVar46._4_4_ * auVar32._4_4_;
    auVar42._8_4_ = auVar46._8_4_ * auVar32._8_4_;
    auVar42._12_4_ = auVar46._12_4_ * auVar32._12_4_;
    auVar73._16_16_ = auVar46;
    auVar73._0_16_ = auVar46;
    auVar35._16_16_ = auVar42;
    auVar35._0_16_ = auVar42;
    auVar41 = vshuff64x2_avx512f(ZEXT1664(auVar46),ZEXT1664(auVar46),0);
    auVar65 = vshuff64x2_avx512f(ZEXT1664(auVar42),ZEXT1664(auVar42),0);
  }
  if (bVar27) {
    auVar35 = vextractf64x4_avx512f(auVar41,1);
    fVar54 = auVar41._4_4_ + auVar35._4_4_;
    auVar43._0_4_ = auVar41._0_4_ + auVar35._0_4_ + auVar41._16_4_ + auVar35._16_4_;
    auVar43._4_4_ = fVar54 + fVar54;
    auVar43._8_4_ = auVar41._8_4_ + auVar35._8_4_ + auVar41._24_4_ + auVar35._24_4_;
    auVar43._12_4_ = auVar41._12_4_ + auVar35._12_4_ + auVar41._28_4_ + auVar35._28_4_;
    auVar50._0_4_ = auVar73._16_4_ + auVar73._0_4_;
    auVar50._4_4_ = auVar73._20_4_ + auVar73._4_4_;
    auVar50._8_4_ = auVar73._24_4_ + auVar73._8_4_;
    auVar50._12_4_ = auVar73._28_4_ + auVar73._12_4_;
    auVar33 = vshufpd_avx(auVar46,auVar46,1);
    auVar32 = vshufps_avx(auVar43,auVar50,0x11);
    auVar61 = vshufps_avx(auVar43,auVar50,0xbb);
    auVar44._0_4_ = auVar61._0_4_ + auVar32._0_4_;
    auVar44._4_4_ = auVar61._4_4_ + auVar32._4_4_;
    auVar44._8_4_ = auVar61._8_4_ + auVar32._8_4_;
    auVar44._12_4_ = auVar61._12_4_ + auVar32._12_4_;
    auVar32 = vshufpd_avx(auVar44,auVar44,1);
    auVar45._0_4_ = auVar44._0_4_ + auVar32._0_4_;
    auVar45._4_4_ = auVar44._4_4_ + auVar32._4_4_;
    auVar45._8_4_ = auVar44._8_4_ + auVar32._8_4_;
    auVar45._12_4_ = auVar44._12_4_ + auVar32._12_4_;
    auVar32 = vhaddps_avx(auVar45,auVar45);
    auVar51._0_4_ = auVar33._0_4_ + auVar46._0_4_;
    auVar51._4_4_ = auVar33._4_4_ + auVar46._4_4_;
    auVar51._8_4_ = auVar33._8_4_ + auVar46._8_4_;
    auVar51._12_4_ = auVar33._12_4_ + auVar46._12_4_;
    auVar33 = vmovshdup_avx(auVar51);
    auVar32 = ZEXT416((uint)((auVar33._0_4_ + auVar51._0_4_ + auVar52._0_4_ + auVar32._0_4_) /
                             (float)elemcount + eps));
    auVar32 = vsqrtss_avx(auVar32,auVar32);
    fVar54 = 1.0 / auVar32._0_4_;
    auVar52 = ZEXT416((uint)fVar54);
    fVar54 = fVar54 * auVar40._0_4_;
    auVar40 = ZEXT416((uint)fVar54);
    auVar41 = vbroadcastss_avx512f(auVar52);
    auVar46 = auVar41._0_16_;
    auVar65 = vbroadcastss_avx512f(ZEXT416((uint)fVar54));
    auVar42 = auVar65._0_16_;
    auVar73 = auVar41._0_32_;
    auVar35 = auVar65._0_32_;
  }
  if (gamma_ptr == (float *)0x0 || beta_ptr == (float *)0x0) {
    auVar53._8_4_ = 0x80000000;
    auVar53._0_8_ = 0x8000000080000000;
    auVar53._12_4_ = 0x80000000;
    auVar53._16_4_ = 0x80000000;
    auVar53._20_4_ = 0x80000000;
    auVar53._24_4_ = 0x80000000;
    auVar53._28_4_ = 0x80000000;
    auVar53._32_4_ = 0x80000000;
    auVar53._36_4_ = 0x80000000;
    auVar53._40_4_ = 0x80000000;
    auVar53._44_4_ = 0x80000000;
    auVar53._48_4_ = 0x80000000;
    auVar53._52_4_ = 0x80000000;
    auVar53._56_4_ = 0x80000000;
    auVar53._60_4_ = 0x80000000;
    auVar65 = vxorps_avx512dq(auVar65,auVar53);
    for (iVar30 = 0; iVar30 + 0xf < iVar28; iVar30 = iVar30 + 0x10) {
      auVar38 = vfmadd132ps_avx512f(*(undefined1 (*) [64])ptr,auVar65,auVar41);
      *(undefined1 (*) [64])ptr = auVar38;
      ptr = (float *)((long)ptr + 0x40);
    }
    auVar21._8_4_ = 0x80000000;
    auVar21._0_8_ = 0x8000000080000000;
    auVar21._12_4_ = 0x80000000;
    auVar21._16_4_ = 0x80000000;
    auVar21._20_4_ = 0x80000000;
    auVar21._24_4_ = 0x80000000;
    auVar21._28_4_ = 0x80000000;
    auVar35 = vxorps_avx512vl(auVar35,auVar21);
    for (; iVar30 + 7 < iVar28; iVar30 = iVar30 + 8) {
      auVar32 = vfmadd132ps_fma(*(undefined1 (*) [32])*(undefined1 (*) [64])ptr,auVar35,auVar73);
      *(undefined1 (*) [32])*(undefined1 (*) [64])ptr = ZEXT1632(auVar32);
      ptr = (float *)(*(undefined1 (*) [64])ptr + 0x20);
    }
    auVar16._8_4_ = 0x80000000;
    auVar16._0_8_ = 0x8000000080000000;
    auVar16._12_4_ = 0x80000000;
    auVar32 = vxorps_avx512vl(auVar42,auVar16);
    for (; iVar30 + 3 < iVar28; iVar30 = iVar30 + 4) {
      auVar33 = vfmadd132ps_fma(*(undefined1 (*) [16])*(undefined1 (*) [64])ptr,auVar32,auVar46);
      *(undefined1 (*) [16])*(undefined1 (*) [64])ptr = auVar33;
      ptr = (float *)(*(undefined1 (*) [64])ptr + 0x10);
    }
    for (; iVar30 < iVar28; iVar30 = iVar30 + 1) {
      auVar32 = vfmsub132ss_fma(ZEXT416(*(uint *)*(undefined1 (*) [64])ptr),auVar40,auVar52);
      *(int *)*(undefined1 (*) [64])ptr = auVar32._0_4_;
      ptr = (float *)(*(undefined1 (*) [64])ptr + 4);
    }
  }
  else {
    iVar30 = 0;
    if (elempack == 0x10) {
      auVar37._8_4_ = 0x80000000;
      auVar37._0_8_ = 0x8000000080000000;
      auVar37._12_4_ = 0x80000000;
      auVar37._16_4_ = 0x80000000;
      auVar37._20_4_ = 0x80000000;
      auVar37._24_4_ = 0x80000000;
      auVar37._28_4_ = 0x80000000;
      auVar37._32_4_ = 0x80000000;
      auVar37._36_4_ = 0x80000000;
      auVar37._40_4_ = 0x80000000;
      auVar37._44_4_ = 0x80000000;
      auVar37._48_4_ = 0x80000000;
      auVar37._52_4_ = 0x80000000;
      auVar37._56_4_ = 0x80000000;
      auVar37._60_4_ = 0x80000000;
      auVar38 = vxorps_avx512dq(auVar65,auVar37);
      for (iVar30 = 0; iVar30 + 0xf < iVar28; iVar30 = iVar30 + 0x10) {
        auVar53 = vbroadcastss_avx512f(ZEXT416((uint)*gamma_ptr));
        auVar37 = vfmadd132ps_avx512f(*(undefined1 (*) [64])ptr,auVar38,auVar41);
        fVar54 = *beta_ptr;
        auVar39._4_4_ = fVar54;
        auVar39._0_4_ = fVar54;
        auVar39._8_4_ = fVar54;
        auVar39._12_4_ = fVar54;
        auVar39._16_4_ = fVar54;
        auVar39._20_4_ = fVar54;
        auVar39._24_4_ = fVar54;
        auVar39._28_4_ = fVar54;
        auVar39._32_4_ = fVar54;
        auVar39._36_4_ = fVar54;
        auVar39._40_4_ = fVar54;
        auVar39._44_4_ = fVar54;
        auVar39._48_4_ = fVar54;
        auVar39._52_4_ = fVar54;
        auVar39._56_4_ = fVar54;
        auVar39._60_4_ = fVar54;
        auVar53 = vfmadd213ps_avx512f(auVar37,auVar53,auVar39);
        *(undefined1 (*) [64])ptr = auVar53;
        ptr = (float *)((long)ptr + 0x40);
        gamma_ptr = gamma_ptr + 1;
        beta_ptr = beta_ptr + 1;
      }
    }
    if (bVar25) {
      auVar22._8_4_ = 0x80000000;
      auVar22._0_8_ = 0x8000000080000000;
      auVar22._12_4_ = 0x80000000;
      auVar22._16_4_ = 0x80000000;
      auVar22._20_4_ = 0x80000000;
      auVar22._24_4_ = 0x80000000;
      auVar22._28_4_ = 0x80000000;
      auVar22._32_4_ = 0x80000000;
      auVar22._36_4_ = 0x80000000;
      auVar22._40_4_ = 0x80000000;
      auVar22._44_4_ = 0x80000000;
      auVar22._48_4_ = 0x80000000;
      auVar22._52_4_ = 0x80000000;
      auVar22._56_4_ = 0x80000000;
      auVar22._60_4_ = 0x80000000;
      auVar38 = vxorps_avx512dq(auVar65,auVar22);
      lVar31 = 0;
      pauVar29 = (undefined1 (*) [64])ptr;
      for (; iVar30 + 0xf < iVar28; iVar30 = iVar30 + 0x10) {
        uVar1 = *(undefined4 *)((long)gamma_ptr + lVar31 + 4);
        auVar77._4_4_ = uVar1;
        auVar77._0_4_ = uVar1;
        auVar77._8_4_ = uVar1;
        auVar77._12_4_ = uVar1;
        auVar77._16_4_ = uVar1;
        auVar77._20_4_ = uVar1;
        auVar77._24_4_ = uVar1;
        auVar77._28_4_ = uVar1;
        uVar1 = *(undefined4 *)((long)gamma_ptr + lVar31);
        auVar53 = vinsertf64x4_avx512f
                            (ZEXT3264(CONCAT428(uVar1,CONCAT424(uVar1,CONCAT420(uVar1,CONCAT416(
                                                  uVar1,CONCAT412(uVar1,CONCAT48(uVar1,CONCAT44(
                                                  uVar1,uVar1)))))))),auVar77,1);
        uVar1 = *(undefined4 *)((long)beta_ptr + lVar31 + 4);
        auVar81._4_4_ = uVar1;
        auVar81._0_4_ = uVar1;
        auVar81._8_4_ = uVar1;
        auVar81._12_4_ = uVar1;
        auVar81._16_4_ = uVar1;
        auVar81._20_4_ = uVar1;
        auVar81._24_4_ = uVar1;
        auVar81._28_4_ = uVar1;
        uVar1 = *(undefined4 *)((long)beta_ptr + lVar31);
        auVar37 = vinsertf64x4_avx512f
                            (ZEXT3264(CONCAT428(uVar1,CONCAT424(uVar1,CONCAT420(uVar1,CONCAT416(
                                                  uVar1,CONCAT412(uVar1,CONCAT48(uVar1,CONCAT44(
                                                  uVar1,uVar1)))))))),auVar81,1);
        auVar39 = vfmadd132ps_avx512f(*pauVar29,auVar38,auVar41);
        auVar53 = vfmadd213ps_avx512f(auVar39,auVar53,auVar37);
        *pauVar29 = auVar53;
        pauVar29 = pauVar29 + 1;
        lVar31 = lVar31 + 8;
      }
      auVar17._8_4_ = 0x80000000;
      auVar17._0_8_ = 0x8000000080000000;
      auVar17._12_4_ = 0x80000000;
      auVar17._16_4_ = 0x80000000;
      auVar17._20_4_ = 0x80000000;
      auVar17._24_4_ = 0x80000000;
      auVar17._28_4_ = 0x80000000;
      auVar36 = vxorps_avx512vl(auVar35,auVar17);
      for (; iVar30 + 7 < iVar28; iVar30 = iVar30 + 8) {
        uVar1 = *(undefined4 *)((long)gamma_ptr + lVar31);
        auVar78._4_4_ = uVar1;
        auVar78._0_4_ = uVar1;
        auVar78._8_4_ = uVar1;
        auVar78._12_4_ = uVar1;
        auVar78._16_4_ = uVar1;
        auVar78._20_4_ = uVar1;
        auVar78._24_4_ = uVar1;
        auVar78._28_4_ = uVar1;
        auVar32 = vfmadd132ps_fma(*(undefined1 (*) [32])(*(undefined1 (*) [64])ptr + lVar31 * 8),
                                  auVar36,auVar73);
        uVar1 = *(undefined4 *)((long)beta_ptr + lVar31);
        auVar18._4_4_ = uVar1;
        auVar18._0_4_ = uVar1;
        auVar18._8_4_ = uVar1;
        auVar18._12_4_ = uVar1;
        auVar18._16_4_ = uVar1;
        auVar18._20_4_ = uVar1;
        auVar18._24_4_ = uVar1;
        auVar18._28_4_ = uVar1;
        auVar34 = vfmadd213ps_avx512vl(ZEXT1632(auVar32),auVar78,auVar18);
        *(undefined1 (*) [32])(*(undefined1 (*) [64])ptr + lVar31 * 8) = auVar34;
        pauVar29 = (undefined1 (*) [64])(*pauVar29 + 0x20);
        lVar31 = lVar31 + 4;
      }
      beta_ptr = (float *)((long)beta_ptr + lVar31);
      gamma_ptr = (float *)((long)gamma_ptr + lVar31);
      ptr = (float *)pauVar29;
    }
    if (bVar26) {
      auVar23._8_4_ = 0x80000000;
      auVar23._0_8_ = 0x8000000080000000;
      auVar23._12_4_ = 0x80000000;
      auVar23._16_4_ = 0x80000000;
      auVar23._20_4_ = 0x80000000;
      auVar23._24_4_ = 0x80000000;
      auVar23._28_4_ = 0x80000000;
      auVar23._32_4_ = 0x80000000;
      auVar23._36_4_ = 0x80000000;
      auVar23._40_4_ = 0x80000000;
      auVar23._44_4_ = 0x80000000;
      auVar23._48_4_ = 0x80000000;
      auVar23._52_4_ = 0x80000000;
      auVar23._56_4_ = 0x80000000;
      auVar23._60_4_ = 0x80000000;
      auVar38 = vxorps_avx512dq(auVar65,auVar23);
      pauVar29 = (undefined1 (*) [64])ptr;
      for (lVar31 = 0; iVar30 + 0xf + (int)lVar31 < iVar28; lVar31 = lVar31 + 0x10) {
        uVar1 = *(undefined4 *)((long)gamma_ptr + lVar31 + 0xc);
        auVar79._20_4_ = uVar1;
        auVar79._16_4_ = uVar1;
        auVar79._24_4_ = uVar1;
        auVar79._28_4_ = uVar1;
        uVar1 = *(undefined4 *)((long)gamma_ptr + lVar31 + 8);
        auVar79._4_4_ = uVar1;
        auVar79._0_4_ = uVar1;
        auVar79._8_4_ = uVar1;
        auVar79._12_4_ = uVar1;
        uVar1 = *(undefined4 *)((long)gamma_ptr + lVar31 + 4);
        uVar2 = *(undefined4 *)((long)gamma_ptr + lVar31);
        uVar3 = *(undefined4 *)((long)beta_ptr + lVar31 + 0xc);
        auVar82._20_4_ = uVar3;
        auVar82._16_4_ = uVar3;
        auVar82._24_4_ = uVar3;
        auVar82._28_4_ = uVar3;
        auVar53 = vinsertf64x4_avx512f
                            (ZEXT3264(CONCAT1616(CONCAT412(uVar1,CONCAT48(uVar1,CONCAT44(uVar1,uVar1
                                                                                        ))),
                                                 CONCAT412(uVar2,CONCAT48(uVar2,CONCAT44(uVar2,uVar2
                                                                                        ))))),
                             auVar79,1);
        uVar1 = *(undefined4 *)((long)beta_ptr + lVar31 + 8);
        auVar82._4_4_ = uVar1;
        auVar82._0_4_ = uVar1;
        auVar82._8_4_ = uVar1;
        auVar82._12_4_ = uVar1;
        uVar1 = *(undefined4 *)((long)beta_ptr + lVar31 + 4);
        uVar2 = *(undefined4 *)((long)beta_ptr + lVar31);
        auVar37 = vinsertf64x4_avx512f
                            (ZEXT3264(CONCAT1616(CONCAT412(uVar1,CONCAT48(uVar1,CONCAT44(uVar1,uVar1
                                                                                        ))),
                                                 CONCAT412(uVar2,CONCAT48(uVar2,CONCAT44(uVar2,uVar2
                                                                                        ))))),
                             auVar82,1);
        auVar39 = vfmadd132ps_avx512f(*pauVar29,auVar38,auVar41);
        auVar53 = vfmadd213ps_avx512f(auVar39,auVar53,auVar37);
        *pauVar29 = auVar53;
        pauVar29 = pauVar29 + 1;
      }
      auVar19._8_4_ = 0x80000000;
      auVar19._0_8_ = 0x8000000080000000;
      auVar19._12_4_ = 0x80000000;
      auVar19._16_4_ = 0x80000000;
      auVar19._20_4_ = 0x80000000;
      auVar19._24_4_ = 0x80000000;
      auVar19._28_4_ = 0x80000000;
      auVar36 = vxorps_avx512vl(auVar35,auVar19);
      for (; iVar30 + 7 + (int)lVar31 < iVar28; lVar31 = lVar31 + 8) {
        uVar1 = *(undefined4 *)((long)gamma_ptr + lVar31 + 4);
        auVar80._20_4_ = uVar1;
        auVar80._16_4_ = uVar1;
        auVar80._24_4_ = uVar1;
        auVar80._28_4_ = uVar1;
        uVar1 = *(undefined4 *)((long)gamma_ptr + lVar31);
        auVar80._4_4_ = uVar1;
        auVar80._0_4_ = uVar1;
        auVar80._8_4_ = uVar1;
        auVar80._12_4_ = uVar1;
        uVar1 = *(undefined4 *)((long)beta_ptr + lVar31 + 4);
        auVar83._20_4_ = uVar1;
        auVar83._16_4_ = uVar1;
        auVar83._24_4_ = uVar1;
        auVar83._28_4_ = uVar1;
        uVar1 = *(undefined4 *)((long)beta_ptr + lVar31);
        auVar83._4_4_ = uVar1;
        auVar83._0_4_ = uVar1;
        auVar83._8_4_ = uVar1;
        auVar83._12_4_ = uVar1;
        auVar32 = vfmadd132ps_fma(*(undefined1 (*) [32])*pauVar29,auVar36,auVar73);
        auVar32 = vfmadd213ps_fma(ZEXT1632(auVar32),auVar80,auVar83);
        *(undefined1 (*) [32])*pauVar29 = ZEXT1632(auVar32);
        pauVar29 = (undefined1 (*) [64])(*pauVar29 + 0x20);
      }
      auVar13._8_4_ = 0x80000000;
      auVar13._0_8_ = 0x8000000080000000;
      auVar13._12_4_ = 0x80000000;
      auVar32 = vxorps_avx512vl(auVar42,auVar13);
      for (; iVar30 + (int)lVar31 + 3 < iVar28; lVar31 = lVar31 + 4) {
        uVar1 = *(undefined4 *)((long)gamma_ptr + lVar31);
        auVar76._4_4_ = uVar1;
        auVar76._0_4_ = uVar1;
        auVar76._8_4_ = uVar1;
        auVar76._12_4_ = uVar1;
        auVar33 = vfmadd132ps_fma(*(undefined1 (*) [16])(*(undefined1 (*) [64])ptr + lVar31 * 4),
                                  auVar32,auVar46);
        uVar1 = *(undefined4 *)((long)beta_ptr + lVar31);
        auVar14._4_4_ = uVar1;
        auVar14._0_4_ = uVar1;
        auVar14._8_4_ = uVar1;
        auVar14._12_4_ = uVar1;
        auVar33 = vfmadd213ps_avx512vl(auVar33,auVar76,auVar14);
        *(undefined1 (*) [16])(*(undefined1 (*) [64])ptr + lVar31 * 4) = auVar33;
        pauVar29 = (undefined1 (*) [64])(*pauVar29 + 0x10);
      }
      iVar30 = iVar30 + (int)lVar31;
      beta_ptr = (float *)((long)beta_ptr + lVar31);
      gamma_ptr = (float *)((long)gamma_ptr + lVar31);
      ptr = (float *)pauVar29;
    }
    if (bVar27) {
      auVar24._8_4_ = 0x80000000;
      auVar24._0_8_ = 0x8000000080000000;
      auVar24._12_4_ = 0x80000000;
      auVar24._16_4_ = 0x80000000;
      auVar24._20_4_ = 0x80000000;
      auVar24._24_4_ = 0x80000000;
      auVar24._28_4_ = 0x80000000;
      auVar24._32_4_ = 0x80000000;
      auVar24._36_4_ = 0x80000000;
      auVar24._40_4_ = 0x80000000;
      auVar24._44_4_ = 0x80000000;
      auVar24._48_4_ = 0x80000000;
      auVar24._52_4_ = 0x80000000;
      auVar24._56_4_ = 0x80000000;
      auVar24._60_4_ = 0x80000000;
      auVar65 = vxorps_avx512dq(auVar65,auVar24);
      lVar31 = 0;
      for (; iVar30 + 0xf < iVar28; iVar30 = iVar30 + 0x10) {
        auVar38 = vfmadd132ps_avx512f(*(undefined1 (*) [64])(*(undefined1 (*) [64])ptr + lVar31),
                                      auVar65,auVar41);
        auVar38 = vfmadd213ps_avx512f(auVar38,*(undefined1 (*) [64])((long)gamma_ptr + lVar31),
                                      *(undefined1 (*) [64])((long)beta_ptr + lVar31));
        *(undefined1 (*) [64])(*(undefined1 (*) [64])ptr + lVar31) = auVar38;
        lVar31 = lVar31 + 0x40;
      }
      auVar20._8_4_ = 0x80000000;
      auVar20._0_8_ = 0x8000000080000000;
      auVar20._12_4_ = 0x80000000;
      auVar20._16_4_ = 0x80000000;
      auVar20._20_4_ = 0x80000000;
      auVar20._24_4_ = 0x80000000;
      auVar20._28_4_ = 0x80000000;
      auVar35 = vxorps_avx512vl(auVar35,auVar20);
      for (; iVar30 + 7 < iVar28; iVar30 = iVar30 + 8) {
        auVar32 = vfmadd132ps_fma(*(undefined1 (*) [32])(*(undefined1 (*) [64])ptr + lVar31),auVar35
                                  ,auVar73);
        auVar32 = vfmadd213ps_fma(ZEXT1632(auVar32),*(undefined1 (*) [32])((long)gamma_ptr + lVar31)
                                  ,*(undefined1 (*) [32])((long)beta_ptr + lVar31));
        *(undefined1 (*) [32])(*(undefined1 (*) [64])ptr + lVar31) = ZEXT1632(auVar32);
        lVar31 = lVar31 + 0x20;
      }
      auVar15._8_4_ = 0x80000000;
      auVar15._0_8_ = 0x8000000080000000;
      auVar15._12_4_ = 0x80000000;
      auVar32 = vxorps_avx512vl(auVar42,auVar15);
      for (; iVar30 + 3 < iVar28; iVar30 = iVar30 + 4) {
        auVar33 = vfmadd132ps_fma(*(undefined1 (*) [16])(*(undefined1 (*) [64])ptr + lVar31),auVar32
                                  ,auVar46);
        auVar33 = vfmadd213ps_fma(auVar33,*(undefined1 (*) [16])((long)gamma_ptr + lVar31),
                                  *(undefined1 (*) [16])((long)beta_ptr + lVar31));
        *(undefined1 (*) [16])(*(undefined1 (*) [64])ptr + lVar31) = auVar33;
        lVar31 = lVar31 + 0x10;
      }
      beta_ptr = (float *)((long)beta_ptr + lVar31);
      gamma_ptr = (float *)((long)gamma_ptr + lVar31);
      ptr = (float *)(*(undefined1 (*) [64])ptr + lVar31);
    }
    for (lVar31 = 0; iVar30 + (int)lVar31 < iVar28; lVar31 = lVar31 + 1) {
      auVar32 = vfnmadd132ss_fma(ZEXT416(*(uint *)(*(undefined1 (*) [64])ptr + lVar31 * 4)),auVar40,
                                 auVar52);
      auVar32 = vfnmadd213ss_fma(ZEXT416((uint)gamma_ptr[lVar31]),auVar32,
                                 ZEXT416((uint)beta_ptr[lVar31]));
      *(int *)(*(undefined1 (*) [64])ptr + lVar31 * 4) = auVar32._0_4_;
    }
  }
  return;
}

Assistant:

static void layernorm(float* ptr, const float* gamma_ptr, const float* beta_ptr, float eps, int elemcount, int elempack)
{
    const int size = elemcount * elempack;

#if __SSE2__
#if __AVX__
#if __AVX512F__
    __m512 _mean_avx512 = _mm512_set1_ps(0.f);
#endif // __AVX512F__
    __m256 _mean_avx = _mm256_set1_ps(0.f);
#endif // __AVX__
    __m128 _mean = _mm_set1_ps(0.f);
#endif // __SSE2__
    float mean = 0.f;
    {
        const float* ptr0 = ptr;

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr0);
            _mean_avx512 = _mm512_add_ps(_mean_avx512, _p);
            ptr0 += 16;
        }
#endif // __AVX512F__
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr0);
            _mean_avx = _mm256_add_ps(_mean_avx, _p);
            ptr0 += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_loadu_ps(ptr0);
            _mean = _mm_add_ps(_mean, _p);
            ptr0 += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            mean += ptr0[0];
            ptr0++;
        }
    }

#if __SSE2__
#if __AVX__
#if __AVX512F__
    if (elempack == 16)
    {
        __m512 _elemcount = _mm512_set1_ps((float)elemcount);
        _mean_avx512 = _mm512_div_ps(_mean_avx512, _elemcount);
    }
#endif // __AVX512F__
    if (elempack == 8)
    {
#if __AVX512F__
        {
            __m256 _mean0 = _mm512_castps512_ps256(_mean_avx512);
            __m256 _mean1 = _mm256_castpd_ps(_mm512_extractf64x4_pd(_mm512_castps_pd(_mean_avx512), 1));
            _mean_avx = _mm256_add_ps(_mean_avx, _mean0);
            _mean_avx = _mm256_add_ps(_mean_avx, _mean1);
        }
#endif // __AVX512F__

        __m256 _elemcount = _mm256_set1_ps((float)elemcount);
        _mean_avx = _mm256_div_ps(_mean_avx, _elemcount);
#if __AVX512F__
        _mean_avx512 = _mm512_insertf32x8(_mm512_castps256_ps512(_mean_avx), _mean_avx, 1);
#endif // __AVX512F__
    }
#endif // __AVX__
    if (elempack == 4)
    {
#if __AVX__
#if __AVX512F__
        {
            __m256 _mean0 = _mm512_castps512_ps256(_mean_avx512);
            __m256 _mean1 = _mm256_castpd_ps(_mm512_extractf64x4_pd(_mm512_castps_pd(_mean_avx512), 1));
            _mean_avx = _mm256_add_ps(_mean_avx, _mean0);
            _mean_avx = _mm256_add_ps(_mean_avx, _mean1);
        }
#endif // __AVX512F__
        {
            __m128 _mean0 = _mm256_castps256_ps128(_mean_avx);
            __m128 _mean1 = _mm256_extractf128_ps(_mean_avx, 1);
            _mean = _mm_add_ps(_mean, _mean0);
            _mean = _mm_add_ps(_mean, _mean1);
        }
#endif // __AVX__

        __m128 _elemcount = _mm_set1_ps((float)elemcount);
        _mean = _mm_div_ps(_mean, _elemcount);
#if __AVX__
        _mean_avx = _mm256_insertf128_ps(_mm256_castps128_ps256(_mean), _mean, 1);
#if __AVX512F__
        _mean_avx512 = _mm512_insertf32x8(_mm512_castps256_ps512(_mean_avx), _mean_avx, 1);
#endif // __AVX512F__
#endif // __AVX__
    }
#endif // __SSE2__
    if (elempack == 1)
    {
#if __SSE2__
#if __AVX__
#if __AVX512F__
        mean += _mm512_comp_reduce_add_ps(_mean_avx512);
#endif // __AVX512F__
        mean += _mm256_reduce_add_ps(_mean_avx);
#endif // __AVX__
        mean += _mm_reduce_add_ps(_mean);
#endif // __SSE2__

        mean = mean / elemcount;
#if __SSE2__
        _mean = _mm_set1_ps(mean);
#if __AVX__
        _mean_avx = _mm256_insertf128_ps(_mm256_castps128_ps256(_mean), _mean, 1);
#if __AVX512F__
        _mean_avx512 = _mm512_insertf32x8(_mm512_castps256_ps512(_mean_avx), _mean_avx, 1);
#endif // __AVX512F__
#endif // __AVX__
#endif // __SSE2__
    }

#if __SSE2__
#if __AVX__
#if __AVX512F__
    __m512 _var_avx512 = _mm512_set1_ps(0.f);
#endif // __AVX512F__
    __m256 _var_avx = _mm256_set1_ps(0.f);
#endif // __AVX__
    __m128 _var = _mm_set1_ps(0.f);
#endif // __SSE2__
    float var = 0.f;
    {
        const float* ptr0 = ptr;

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr0);
            _p = _mm512_sub_ps(_p, _mean_avx512);
            _var_avx512 = _mm512_fmadd_ps(_p, _p, _var_avx512);
            ptr0 += 16;
        }
#endif // __AVX512F__
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr0);
            _p = _mm256_sub_ps(_p, _mean_avx);
            _var_avx = _mm256_comp_fmadd_ps(_p, _p, _var_avx);
            ptr0 += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_loadu_ps(ptr0);
            _p = _mm_sub_ps(_p, _mean);
            _var = _mm_comp_fmadd_ps(_p, _p, _var);
            ptr0 += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            float v = ptr0[0] - mean;
            var += v * v;
            ptr0++;
        }
    }

#if __SSE2__
#if __AVX__
#if __AVX512F__
    if (elempack == 16)
    {
        __m512 _elemcount = _mm512_set1_ps((float)elemcount);
        __m512 _eps = _mm512_set1_ps(eps);
        _var_avx512 = _mm512_div_ps(_var_avx512, _elemcount);
        _var_avx512 = _mm512_add_ps(_var_avx512, _eps);
        __m256 _var0 = _mm256_rsqrt_ps(_mm512_extractf32x8_ps(_var_avx512, 0));
        __m256 _var1 = _mm256_rsqrt_ps(_mm512_extractf32x8_ps(_var_avx512, 1));
        _var_avx512 = _mm512_insertf32x8(_mm512_castps256_ps512(_var0), _var1, 1);
        _mean_avx512 = _mm512_mul_ps(_mean_avx512, _var_avx512);
    }
#endif // __AVX512F__
    if (elempack == 8)
    {
#if __AVX512F__
        {
            __m256 _var0 = _mm512_castps512_ps256(_var_avx512);
            __m256 _var1 = _mm256_castpd_ps(_mm512_extractf64x4_pd(_mm512_castps_pd(_var_avx512), 1));
            _var_avx = _mm256_add_ps(_var_avx, _var0);
            _var_avx = _mm256_add_ps(_var_avx, _var1);
        }
#endif // __AVX512F__

        __m256 _elemcount = _mm256_set1_ps((float)elemcount);
        __m256 _eps = _mm256_set1_ps(eps);
        _var_avx = _mm256_div_ps(_var_avx, _elemcount);
        _var_avx = _mm256_add_ps(_var_avx, _eps);
        _var_avx = _mm256_rsqrt_ps(_var_avx);
        _mean_avx = _mm256_mul_ps(_mean_avx, _var_avx);
#if __AVX512F__
        _var_avx512 = _mm512_insertf32x8(_mm512_castps256_ps512(_var_avx), _var_avx, 1);
        _mean_avx512 = _mm512_insertf32x8(_mm512_castps256_ps512(_mean_avx), _mean_avx, 1);
#endif // __AVX512F__
    }
#endif // __AVX__
    if (elempack == 4)
    {
#if __AVX__
#if __AVX512F__
        {
            __m256 _var0 = _mm512_castps512_ps256(_var_avx512);
            __m256 _var1 = _mm256_castpd_ps(_mm512_extractf64x4_pd(_mm512_castps_pd(_var_avx512), 1));
            _var_avx = _mm256_add_ps(_var_avx, _var0);
            _var_avx = _mm256_add_ps(_var_avx, _var1);
        }
#endif // __AVX512F__
        {
            __m128 _var0 = _mm256_castps256_ps128(_var_avx);
            __m128 _var1 = _mm256_extractf128_ps(_var_avx, 1);
            _var = _mm_add_ps(_var, _var0);
            _var = _mm_add_ps(_var, _var1);
        }
#endif // __AVX__

        __m128 _elemcount = _mm_set1_ps((float)elemcount);
        __m128 _eps = _mm_set1_ps(eps);
        _var = _mm_div_ps(_var, _elemcount);
        _var = _mm_add_ps(_var, _eps);
        _var = _mm_rsqrt_ps(_var);
        _mean = _mm_mul_ps(_mean, _var);
#if __AVX__
        _var_avx = _mm256_insertf128_ps(_mm256_castps128_ps256(_var), _var, 1);
        _mean_avx = _mm256_insertf128_ps(_mm256_castps128_ps256(_mean), _mean, 1);
#if __AVX512F__
        _var_avx512 = _mm512_insertf32x8(_mm512_castps256_ps512(_var_avx), _var_avx, 1);
        _mean_avx512 = _mm512_insertf32x8(_mm512_castps256_ps512(_mean_avx), _mean_avx, 1);
#endif // __AVX512F__
#endif // __AVX__
    }
#endif // __SSE2__
    if (elempack == 1)
    {
#if __SSE2__
#if __AVX__
#if __AVX512F__
        var += _mm512_comp_reduce_add_ps(_var_avx512);
#endif // __AVX512F__
        var += _mm256_reduce_add_ps(_var_avx);
#endif // __AVX__
        var += _mm_reduce_add_ps(_var);
#endif // __SSE2__

        var = 1.f / sqrtf(var / elemcount + eps);
        mean = mean * var;
#if __SSE2__
        _var = _mm_set1_ps(var);
        _mean = _mm_set1_ps(mean);
#if __AVX__
        _var_avx = _mm256_insertf128_ps(_mm256_castps128_ps256(_var), _var, 1);
        _mean_avx = _mm256_insertf128_ps(_mm256_castps128_ps256(_mean), _mean, 1);
#if __AVX512F__
        _var_avx512 = _mm512_insertf32x8(_mm512_castps256_ps512(_var_avx), _var_avx, 1);
        _mean_avx512 = _mm512_insertf32x8(_mm512_castps256_ps512(_mean_avx), _mean_avx, 1);
#endif // __AVX512F__
#endif // __AVX__
#endif // __SSE2__
    }

    if (gamma_ptr && beta_ptr)
    {
        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        if (elempack == 16)
        {
            for (; i + 15 < size; i += 16)
            {
                __m512 _p = _mm512_loadu_ps(ptr);
                __m512 _gamma = _mm512_set1_ps(gamma_ptr[0]);
                __m512 _beta = _mm512_set1_ps(beta_ptr[0]);
                _p = _mm512_fmsub_ps(_p, _var_avx512, _mean_avx512);
                _p = _mm512_fmadd_ps(_p, _gamma, _beta);
                _mm512_storeu_ps(ptr, _p);
                ptr += 16;
                gamma_ptr += 1;
                beta_ptr += 1;
            }
        }
#endif // __AVX512F__
        if (elempack == 8)
        {
#if __AVX512F__
            for (; i + 15 < size; i += 16)
            {
                __m512 _p = _mm512_loadu_ps(ptr);
                __m256 _gamma0 = _mm256_set1_ps(gamma_ptr[0]);
                __m256 _gamma1 = _mm256_set1_ps(gamma_ptr[1]);
                __m512 _gamma = _mm512_insertf32x8(_mm512_castps256_ps512(_gamma0), _gamma1, 1);
                __m256 _beta0 = _mm256_set1_ps(beta_ptr[0]);
                __m256 _beta1 = _mm256_set1_ps(beta_ptr[1]);
                __m512 _beta = _mm512_insertf32x8(_mm512_castps256_ps512(_beta0), _beta1, 1);
                _p = _mm512_fmsub_ps(_p, _var_avx512, _mean_avx512);
                _p = _mm512_fmadd_ps(_p, _gamma, _beta);
                _mm512_storeu_ps(ptr, _p);
                ptr += 16;
                gamma_ptr += 2;
                beta_ptr += 2;
            }
#endif // __AVX512F__
            for (; i + 7 < size; i += 8)
            {
                __m256 _p = _mm256_loadu_ps(ptr);
                __m256 _gamma = _mm256_set1_ps(gamma_ptr[0]);
                __m256 _beta = _mm256_set1_ps(beta_ptr[0]);
                _p = _mm256_comp_fmsub_ps(_p, _var_avx, _mean_avx);
                _p = _mm256_comp_fmadd_ps(_p, _gamma, _beta);
                _mm256_storeu_ps(ptr, _p);
                ptr += 8;
                gamma_ptr += 1;
                beta_ptr += 1;
            }
        }
#endif // __AVX__
        if (elempack == 4)
        {
#if __AVX__
#if __AVX512F__
            for (; i + 15 < size; i += 16)
            {
                __m512 _p = _mm512_loadu_ps(ptr);
                __m128 _gamma0 = _mm_set1_ps(gamma_ptr[0]);
                __m128 _gamma1 = _mm_set1_ps(gamma_ptr[1]);
                __m128 _gamma2 = _mm_set1_ps(gamma_ptr[2]);
                __m128 _gamma3 = _mm_set1_ps(gamma_ptr[3]);
                __m256 _gamma01 = _mm256_insertf128_ps(_mm256_castps128_ps256(_gamma0), _gamma1, 1);
                __m256 _gamma23 = _mm256_insertf128_ps(_mm256_castps128_ps256(_gamma2), _gamma3, 1);
                __m512 _gamma = _mm512_insertf32x8(_mm512_castps256_ps512(_gamma01), _gamma23, 1);
                __m128 _beta0 = _mm_set1_ps(beta_ptr[0]);
                __m128 _beta1 = _mm_set1_ps(beta_ptr[1]);
                __m128 _beta2 = _mm_set1_ps(beta_ptr[2]);
                __m128 _beta3 = _mm_set1_ps(beta_ptr[3]);
                __m256 _beta01 = _mm256_insertf128_ps(_mm256_castps128_ps256(_beta0), _beta1, 1);
                __m256 _beta23 = _mm256_insertf128_ps(_mm256_castps128_ps256(_beta2), _beta3, 1);
                __m512 _beta = _mm512_insertf32x8(_mm512_castps256_ps512(_beta01), _beta23, 1);
                _p = _mm512_fmsub_ps(_p, _var_avx512, _mean_avx512);
                _p = _mm512_fmadd_ps(_p, _gamma, _beta);
                _mm512_storeu_ps(ptr, _p);
                ptr += 16;
                gamma_ptr += 4;
                beta_ptr += 4;
            }
#endif // __AVX512F__
            for (; i + 7 < size; i += 8)
            {
                __m256 _p = _mm256_loadu_ps(ptr);
                __m128 _gamma0 = _mm_set1_ps(gamma_ptr[0]);
                __m128 _gamma1 = _mm_set1_ps(gamma_ptr[1]);
                __m256 _gamma = _mm256_insertf128_ps(_mm256_castps128_ps256(_gamma0), _gamma1, 1);
                __m128 _beta0 = _mm_set1_ps(beta_ptr[0]);
                __m128 _beta1 = _mm_set1_ps(beta_ptr[1]);
                __m256 _beta = _mm256_insertf128_ps(_mm256_castps128_ps256(_beta0), _beta1, 1);
                _p = _mm256_comp_fmsub_ps(_p, _var_avx, _mean_avx);
                _p = _mm256_comp_fmadd_ps(_p, _gamma, _beta);
                _mm256_storeu_ps(ptr, _p);
                ptr += 8;
                gamma_ptr += 2;
                beta_ptr += 2;
            }
#endif // __AVX__
            for (; i + 3 < size; i += 4)
            {
                __m128 _p = _mm_loadu_ps(ptr);
                __m128 _gamma = _mm_set1_ps(gamma_ptr[0]);
                __m128 _beta = _mm_set1_ps(beta_ptr[0]);
                _p = _mm_comp_fmsub_ps(_p, _var, _mean);
                _p = _mm_comp_fmadd_ps(_p, _gamma, _beta);
                _mm_storeu_ps(ptr, _p);
                ptr += 4;
                gamma_ptr += 1;
                beta_ptr += 1;
            }
        }
        if (elempack == 1)
        {
#if __AVX__
#if __AVX512F__
            for (; i + 15 < size; i += 16)
            {
                __m512 _p = _mm512_loadu_ps(ptr);
                __m512 _gamma = _mm512_loadu_ps(gamma_ptr);
                __m512 _beta = _mm512_loadu_ps(beta_ptr);
                _p = _mm512_fmsub_ps(_p, _var_avx512, _mean_avx512);
                _p = _mm512_fmadd_ps(_p, _gamma, _beta);
                _mm512_storeu_ps(ptr, _p);
                ptr += 16;
                gamma_ptr += 16;
                beta_ptr += 16;
            }
#endif // __AVX512F__
            for (; i + 7 < size; i += 8)
            {
                __m256 _p = _mm256_loadu_ps(ptr);
                __m256 _gamma = _mm256_loadu_ps(gamma_ptr);
                __m256 _beta = _mm256_loadu_ps(beta_ptr);
                _p = _mm256_comp_fmsub_ps(_p, _var_avx, _mean_avx);
                _p = _mm256_comp_fmadd_ps(_p, _gamma, _beta);
                _mm256_storeu_ps(ptr, _p);
                ptr += 8;
                gamma_ptr += 8;
                beta_ptr += 8;
            }
#endif // __AVX__
            for (; i + 3 < size; i += 4)
            {
                __m128 _p = _mm_loadu_ps(ptr);
                __m128 _gamma = _mm_loadu_ps(gamma_ptr);
                __m128 _beta = _mm_loadu_ps(beta_ptr);
                _p = _mm_comp_fmsub_ps(_p, _var, _mean);
                _p = _mm_comp_fmadd_ps(_p, _gamma, _beta);
                _mm_storeu_ps(ptr, _p);
                ptr += 4;
                gamma_ptr += 4;
                beta_ptr += 4;
            }
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            ptr[0] = (ptr[0] * var - mean) * gamma_ptr[0] + beta_ptr[0];
            ptr++;
            gamma_ptr++;
            beta_ptr++;
        }
    }
    else
    {
        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            _p = _mm512_fmsub_ps(_p, _var_avx512, _mean_avx512);
            _mm512_storeu_ps(ptr, _p);
            ptr += 16;
        }
#endif // __AVX512F__
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _p = _mm256_comp_fmsub_ps(_p, _var_avx, _mean_avx);
            _mm256_storeu_ps(ptr, _p);
            ptr += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_loadu_ps(ptr);
            _p = _mm_comp_fmsub_ps(_p, _var, _mean);
            _mm_storeu_ps(ptr, _p);
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            ptr[0] = ptr[0] * var - mean;
            ptr++;
        }
    }
}